

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall correctness_mul_long_signed2_Test::TestBody(correctness_mul_long_signed2_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  big_integer a;
  big_integer c;
  AssertHelper AStack_148;
  internal local_140 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  string local_130;
  string local_110;
  long *local_f0 [7];
  big_integer local_b8;
  big_integer local_80;
  big_integer local_48;
  
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"-100000000000000000000000000","");
  big_integer::big_integer(&local_b8,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"10000000000000000000000000000000000000000000000000000","");
  big_integer::big_integer(&local_48,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  big_integer::big_integer(&local_80,&local_b8);
  operator*((big_integer *)local_f0,&local_80,&local_b8);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            (local_140,"a * a","c",(big_integer *)local_f0,&local_48);
  big_integer::~big_integer((big_integer *)local_f0);
  big_integer::~big_integer(&local_80);
  if (local_140[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if (local_138.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_138.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x20f,message);
    testing::internal::AssertHelper::operator=(&AStack_148,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_148);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0[0] !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_f0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_48);
  big_integer::~big_integer(&local_b8);
  return;
}

Assistant:

TEST(correctness, mul_return_value)
{
    big_integer a = 5;
    big_integer b = 2;

    (a *= b) *= b;
    EXPECT_EQ(a, 20);
}